

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInput430c6
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  reference pvVar1;
  float *fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x170);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar1[0] = '\0';
  pvVar1[1] = '\0';
  pvVar1[2] = 0x80;
  pvVar1[3] = '?';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '@';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '@';
  pvVar1[0xb] = '@';
  pvVar1[0xc] = '\0';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = 0x80;
  pvVar1[0xf] = '@';
  pvVar1[0x10] = '\0';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = 0xa0;
  pvVar1[0x13] = '@';
  pvVar1[0x14] = '\0';
  pvVar1[0x15] = '\0';
  pvVar1[0x16] = '\0';
  pvVar1[0x17] = '\0';
  pvVar1[0x18] = '\0';
  pvVar1[0x19] = '\0';
  pvVar1[0x1a] = 0xc0;
  pvVar1[0x1b] = '@';
  pvVar1[0x1c] = '\0';
  pvVar1[0x1d] = '\0';
  pvVar1[0x1e] = 0xe0;
  pvVar1[0x1f] = '@';
  pvVar1[0x20] = '\0';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '\0';
  pvVar1[0x23] = 'A';
  pvVar1[0x24] = '\0';
  pvVar1[0x25] = '\0';
  pvVar1[0x26] = '\x10';
  pvVar1[0x27] = 'A';
  pvVar1[0x28] = '\0';
  pvVar1[0x29] = '\0';
  pvVar1[0x2a] = ' ';
  pvVar1[0x2b] = 'A';
  pvVar1[0x2c] = '\0';
  pvVar1[0x2d] = '\0';
  pvVar1[0x2e] = '0';
  pvVar1[0x2f] = 'A';
  pvVar1[0x30] = '\0';
  pvVar1[0x31] = '\0';
  pvVar1[0x32] = '@';
  pvVar1[0x33] = 'A';
  pvVar1[0x34] = '\0';
  pvVar1[0x35] = '\0';
  pvVar1[0x36] = '\0';
  pvVar1[0x37] = '\0';
  pvVar1[0x38] = '\0';
  pvVar1[0x39] = '\0';
  pvVar1[0x3a] = '\0';
  pvVar1[0x3b] = '\0';
  pvVar1[0x3c] = '\0';
  pvVar1[0x3d] = '\0';
  pvVar1[0x3e] = '\0';
  pvVar1[0x3f] = '\0';
  pvVar1[0x40] = '\0';
  pvVar1[0x41] = '\0';
  pvVar1[0x42] = 'P';
  pvVar1[0x43] = 'A';
  pvVar1[0x44] = '\0';
  pvVar1[0x45] = '\0';
  pvVar1[0x46] = '`';
  pvVar1[0x47] = 'A';
  pvVar1[0x48] = '\0';
  pvVar1[0x49] = '\0';
  pvVar1[0x4a] = 'p';
  pvVar1[0x4b] = 'A';
  pvVar1[0x4c] = '\0';
  pvVar1[0x4d] = '\0';
  pvVar1[0x4e] = '\0';
  pvVar1[0x4f] = '\0';
  pvVar1[0x50] = '\0';
  pvVar1[0x51] = '\0';
  pvVar1[0x52] = 0x80;
  pvVar1[0x53] = 'A';
  pvVar1[0x54] = '\0';
  pvVar1[0x55] = '\0';
  pvVar1[0x56] = 0x88;
  pvVar1[0x57] = 'A';
  pvVar1[0x58] = '\0';
  pvVar1[0x59] = '\0';
  pvVar1[0x5a] = 0x90;
  pvVar1[0x5b] = 'A';
  pvVar1[0x5c] = '\0';
  pvVar1[0x5d] = '\0';
  pvVar1[0x5e] = '\0';
  pvVar1[0x5f] = '\0';
  pvVar1[0x60] = '\0';
  pvVar1[0x61] = '\0';
  pvVar1[0x62] = 0x98;
  pvVar1[99] = 'A';
  pvVar1[100] = '\0';
  pvVar1[0x65] = '\0';
  pvVar1[0x66] = 0xa0;
  pvVar1[0x67] = 'A';
  pvVar1[0x68] = '\0';
  pvVar1[0x69] = '\0';
  pvVar1[0x6a] = 0xa8;
  pvVar1[0x6b] = 'A';
  pvVar1[0x6c] = '\0';
  pvVar1[0x6d] = '\0';
  pvVar1[0x6e] = 0xb0;
  pvVar1[0x6f] = 'A';
  pvVar1[0x70] = '\0';
  pvVar1[0x71] = '\0';
  pvVar1[0x72] = 0xb8;
  pvVar1[0x73] = 'A';
  pvVar1[0x74] = '\0';
  pvVar1[0x75] = '\0';
  pvVar1[0x76] = 0xc0;
  pvVar1[0x77] = 'A';
  pvVar1[0x78] = '\0';
  pvVar1[0x79] = '\0';
  pvVar1[0x7a] = 200;
  pvVar1[0x7b] = 'A';
  pvVar1[0x7c] = '\0';
  pvVar1[0x7d] = '\0';
  pvVar1[0x7e] = 0xd0;
  pvVar1[0x7f] = 'A';
  pvVar1[0x80] = '\0';
  pvVar1[0x81] = '\0';
  pvVar1[0x82] = 0xd8;
  pvVar1[0x83] = 'A';
  pvVar1[0x84] = '\0';
  pvVar1[0x85] = '\0';
  pvVar1[0x86] = 0xe0;
  pvVar1[0x87] = 'A';
  pvVar1[0x88] = '\0';
  pvVar1[0x89] = '\0';
  pvVar1[0x8a] = '\0';
  pvVar1[0x8b] = '\0';
  pvVar1[0x8c] = '\0';
  pvVar1[0x8d] = '\0';
  pvVar1[0x8e] = '\0';
  pvVar1[0x8f] = '\0';
  pvVar1[0x90] = '\0';
  pvVar1[0x91] = '\0';
  pvVar1[0x92] = 0xe8;
  pvVar1[0x93] = 'A';
  pvVar1[0x94] = '\0';
  pvVar1[0x95] = '\0';
  pvVar1[0x96] = 0xf0;
  pvVar1[0x97] = 'A';
  pvVar1[0x98] = '\0';
  pvVar1[0x99] = '\0';
  pvVar1[0x9a] = 0xf8;
  pvVar1[0x9b] = 'A';
  pvVar1[0x9c] = '\0';
  pvVar1[0x9d] = '\0';
  pvVar1[0x9e] = '\0';
  pvVar1[0x9f] = '\0';
  pvVar1[0xa0] = '\0';
  pvVar1[0xa1] = '\0';
  pvVar1[0xa2] = '\0';
  pvVar1[0xa3] = 'B';
  pvVar1[0xa4] = '\0';
  pvVar1[0xa5] = '\0';
  pvVar1[0xa6] = '\x04';
  pvVar1[0xa7] = 'B';
  pvVar1[0xa8] = '\0';
  pvVar1[0xa9] = '\0';
  pvVar1[0xaa] = '\b';
  pvVar1[0xab] = 'B';
  pvVar1[0xac] = '\0';
  pvVar1[0xad] = '\0';
  pvVar1[0xae] = '\0';
  pvVar1[0xaf] = '\0';
  pvVar1[0xb0] = '\0';
  pvVar1[0xb1] = '\0';
  pvVar1[0xb2] = '\f';
  pvVar1[0xb3] = 'B';
  pvVar1[0xb4] = '\0';
  pvVar1[0xb5] = '\0';
  pvVar1[0xb6] = '\x10';
  pvVar1[0xb7] = 'B';
  pvVar1[0xb8] = '\0';
  pvVar1[0xb9] = '\0';
  pvVar1[0xba] = '\x14';
  pvVar1[0xbb] = 'B';
  pvVar1[0xbc] = '\0';
  pvVar1[0xbd] = '\0';
  pvVar1[0xbe] = '\0';
  pvVar1[0xbf] = '\0';
  pvVar1[0xc0] = '\0';
  pvVar1[0xc1] = '\0';
  pvVar1[0xc2] = '\x18';
  pvVar1[0xc3] = 'B';
  pvVar1[0xc4] = '\0';
  pvVar1[0xc5] = '\0';
  pvVar1[0xc6] = '\x1c';
  pvVar1[199] = 'B';
  pvVar1[200] = '\0';
  pvVar1[0xc9] = '\0';
  pvVar1[0xca] = ' ';
  pvVar1[0xcb] = 'B';
  pvVar1[0xcc] = '\0';
  pvVar1[0xcd] = '\0';
  pvVar1[0xce] = '\0';
  pvVar1[0xcf] = '\0';
  pvVar1[0xd0] = '\0';
  pvVar1[0xd1] = '\0';
  pvVar1[0xd2] = '$';
  pvVar1[0xd3] = 'B';
  pvVar1[0xd4] = '\0';
  pvVar1[0xd5] = '\0';
  pvVar1[0xd6] = '(';
  pvVar1[0xd7] = 'B';
  pvVar1[0xd8] = '\0';
  pvVar1[0xd9] = '\0';
  pvVar1[0xda] = ',';
  pvVar1[0xdb] = 'B';
  pvVar1[0xdc] = '\0';
  pvVar1[0xdd] = '\0';
  pvVar1[0xde] = '\0';
  pvVar1[0xdf] = '\0';
  pvVar1[0xe0] = '\0';
  pvVar1[0xe1] = '\0';
  pvVar1[0xe2] = '0';
  pvVar1[0xe3] = 'B';
  pvVar1[0xe4] = '\0';
  pvVar1[0xe5] = '\0';
  pvVar1[0xe6] = '4';
  pvVar1[0xe7] = 'B';
  pvVar1[0xe8] = '\0';
  pvVar1[0xe9] = '\0';
  pvVar1[0xea] = '8';
  pvVar1[0xeb] = 'B';
  pvVar1[0xec] = '\0';
  pvVar1[0xed] = '\0';
  pvVar1[0xee] = '\0';
  pvVar1[0xef] = '\0';
  pvVar1[0xf0] = '\0';
  pvVar1[0xf1] = '\0';
  pvVar1[0xf2] = '<';
  pvVar1[0xf3] = 'B';
  pvVar1[0xf4] = '\0';
  pvVar1[0xf5] = '\0';
  pvVar1[0xf6] = '@';
  pvVar1[0xf7] = 'B';
  pvVar1[0xf8] = '\0';
  pvVar1[0xf9] = '\0';
  pvVar1[0xfa] = 'D';
  pvVar1[0xfb] = 'B';
  pvVar1[0xfc] = '\0';
  pvVar1[0xfd] = '\0';
  pvVar1[0xfe] = 'H';
  pvVar1[0xff] = 'B';
  pvVar1[0x100] = '\0';
  pvVar1[0x101] = '\0';
  pvVar1[0x102] = 'L';
  pvVar1[0x103] = 'B';
  pvVar1[0x104] = '\0';
  pvVar1[0x105] = '\0';
  pvVar1[0x106] = 'P';
  pvVar1[0x107] = 'B';
  pvVar1[0x108] = '\0';
  pvVar1[0x109] = '\0';
  pvVar1[0x10a] = 'T';
  pvVar1[0x10b] = 'B';
  pvVar1[0x10c] = '\0';
  pvVar1[0x10d] = '\0';
  pvVar1[0x10e] = 'X';
  pvVar1[0x10f] = 'B';
  pvVar1[0x110] = '\0';
  pvVar1[0x111] = '\0';
  pvVar1[0x112] = '\\';
  pvVar1[0x113] = 'B';
  pvVar1[0x114] = '\0';
  pvVar1[0x115] = '\0';
  pvVar1[0x116] = '`';
  pvVar1[0x117] = 'B';
  pvVar1[0x118] = '\0';
  pvVar1[0x119] = '\0';
  pvVar1[0x11a] = 'd';
  pvVar1[0x11b] = 'B';
  pvVar1[0x11c] = '\0';
  pvVar1[0x11d] = '\0';
  pvVar1[0x11e] = 'h';
  pvVar1[0x11f] = 'B';
  pvVar1[0x120] = '\0';
  pvVar1[0x121] = '\0';
  pvVar1[0x122] = 'l';
  pvVar1[0x123] = 'B';
  pvVar1[0x124] = '\0';
  pvVar1[0x125] = '\0';
  pvVar1[0x126] = 'p';
  pvVar1[0x127] = 'B';
  pvVar1[0x128] = '\0';
  pvVar1[0x129] = '\0';
  pvVar1[0x12a] = 't';
  pvVar1[299] = 'B';
  pvVar1[300] = '\0';
  pvVar1[0x12d] = '\0';
  pvVar1[0x12e] = 'x';
  pvVar1[0x12f] = 'B';
  pvVar1[0x130] = '\0';
  pvVar1[0x131] = '\0';
  pvVar1[0x132] = '|';
  pvVar1[0x133] = 'B';
  pvVar1[0x134] = '\0';
  pvVar1[0x135] = '\0';
  pvVar1[0x136] = 0x80;
  pvVar1[0x137] = 'B';
  pvVar1[0x138] = '\0';
  pvVar1[0x139] = '\0';
  pvVar1[0x13a] = 0x82;
  pvVar1[0x13b] = 'B';
  pvVar1[0x13c] = '\0';
  pvVar1[0x13d] = '\0';
  pvVar1[0x13e] = 0x84;
  pvVar1[0x13f] = 'B';
  pvVar1[0x140] = '\0';
  pvVar1[0x141] = '\0';
  pvVar1[0x142] = 0x86;
  pvVar1[0x143] = 'B';
  pvVar1[0x144] = '\0';
  pvVar1[0x145] = '\0';
  pvVar1[0x146] = 0x88;
  pvVar1[0x147] = 'B';
  pvVar1[0x148] = '\0';
  pvVar1[0x149] = '\0';
  pvVar1[0x14a] = 0x8a;
  pvVar1[0x14b] = 'B';
  pvVar1[0x14c] = '\0';
  pvVar1[0x14d] = '\0';
  pvVar1[0x14e] = 0x8c;
  pvVar1[0x14f] = 'B';
  pvVar1[0x150] = '\0';
  pvVar1[0x151] = '\0';
  pvVar1[0x152] = 0x8e;
  pvVar1[0x153] = 'B';
  pvVar1[0x154] = '\0';
  pvVar1[0x155] = '\0';
  pvVar1[0x156] = 0x90;
  pvVar1[0x157] = 'B';
  pvVar1[0x158] = '\0';
  pvVar1[0x159] = '\0';
  pvVar1[0x15a] = 0x92;
  pvVar1[0x15b] = 'B';
  pvVar1[0x15c] = '\0';
  pvVar1[0x15d] = '\0';
  pvVar1[0x15e] = 0x94;
  pvVar1[0x15f] = 'B';
  pvVar1[0x160] = '\0';
  pvVar1[0x161] = '\0';
  pvVar1[0x162] = 0x96;
  pvVar1[0x163] = 'B';
  pvVar1[0x164] = '\0';
  pvVar1[0x165] = '\0';
  pvVar1[0x166] = 0x98;
  pvVar1[0x167] = 'B';
  pvVar1[0x168] = '\0';
  pvVar1[0x169] = '\0';
  pvVar1[0x16a] = 0x9a;
  pvVar1[0x16b] = 'B';
  pvVar1[0x16c] = '\0';
  pvVar1[0x16d] = '\0';
  pvVar1[0x16e] = 0x9c;
  pvVar1[0x16f] = 'B';
  return 
  "\nlayout(std430, binding = 0) buffer Input {\n  float data0[2];\n  float data1[3];\n  vec2 data2;\n  float data3[5];\n  vec3 data4[2];\n  float data5[2];\n  mat2 data6[2];\n  mat3 data7[2];\n  mat4 data8[2];\n} g_input;\nlayout(std430, binding = 1) buffer Output {\n  float data0[2];\n  float data1[3];\n  vec2 data2;\n  float data3[5];\n  vec3 data4[2];\n  float data5[2];\n  mat2 data6[2];\n  mat3 data7[2];\n  mat4 data8[2];\n} g_output;\nvoid main() {\n  for (int i = 0; i < g_input.data0.length(); ++i) g_output.data0[i] = g_input.data0[i];\n  for (int i = 0; i < g_input.data1.length(); ++i) g_output.data1[i] = g_input.data1[i];\n  g_output.data2 = g_input.data2;\n  for (int i = 0; i < g_input.data3.length(); ++i) g_output.data3[i] = g_input.data3[i];\n  for (int i = 0; i < g_input.data4.length(); ++i) g_output.data4[i] = g_input.data4[i];\n  for (int i = 0; i < g_input.data5.length(); ++i) g_output.data5[i] = g_input.data5[i];\n  for (int i = 0; i < g_input.data6.length(); ++i) g_output.data6[i] = g_input.data6[i];\n  for (int i = 0; i < g_input.data7.length(); ++i) g_output.data7[i] = g_input.data7[i];\n  for (int i = 0; i < g_input.data8.length(); ++i) g_output.data8[i] = g_input.data8[i];\n}"
  ;
}

Assistant:

const char* GetInput430c6(std::vector<GLubyte>& in_data)
{
	in_data.resize(92 * 4);
	float* fp = reinterpret_cast<float*>(&in_data[0]);
	fp[0]	 = 1.0f;
	fp[1]	 = 2.0f;
	fp[2]	 = 3.0f;
	fp[3]	 = 4.0f;
	fp[4]	 = 5.0f;
	fp[5]	 = 0.0f;
	fp[6]	 = 6.0f;
	fp[7]	 = 7.0f;
	fp[8]	 = 8.0f;
	fp[9]	 = 9.0f;
	fp[10]	= 10.0f;
	fp[11]	= 11.0f;
	fp[12]	= 12.0f;
	fp[13]	= 0.0f;
	fp[14]	= 0.0f;
	fp[15]	= 0.0f;
	fp[16]	= 13.0f;
	fp[17]	= 14.0f;
	fp[18]	= 15.0f;
	fp[19]	= 0.0f;
	fp[20]	= 16.0f;
	fp[21]	= 17.0f;
	fp[22]	= 18.0f;
	fp[23]	= 0.0f;
	fp[24]	= 19.0f;
	fp[25]	= 20.0f;
	fp[26]	= 21.0f;
	fp[27]	= 22.0f;
	fp[28]	= 23.0f;
	fp[29]	= 24.0f;
	fp[30]	= 25.0f;
	fp[31]	= 26.0f;
	fp[32]	= 27.0f;
	fp[33]	= 28.0f;
	fp[34]	= 0.0f;
	fp[35]	= 0.0f;
	fp[36]	= 29.0f;
	fp[37]	= 30.0f;
	fp[38]	= 31.0f;
	fp[39]	= 0.0f;
	fp[40]	= 32.0f;
	fp[41]	= 33.0f;
	fp[42]	= 34.0f;
	fp[43]	= 0.0f;
	fp[44]	= 35.0f;
	fp[45]	= 36.0f;
	fp[46]	= 37.0f;
	fp[47]	= 0.0f;
	fp[48]	= 38.0f;
	fp[49]	= 39.0f;
	fp[50]	= 40.0f;
	fp[51]	= 0.0f;
	fp[52]	= 41.0f;
	fp[53]	= 42.0f;
	fp[54]	= 43.0f;
	fp[55]	= 0.0f;
	fp[56]	= 44.0f;
	fp[57]	= 45.0f;
	fp[58]	= 46.0f;
	fp[59]	= 0.0f;
	fp[60]	= 47.0f;
	fp[61]	= 48.0f;
	fp[62]	= 49.0f;
	fp[63]	= 50.0f;
	fp[64]	= 51.0f;
	fp[65]	= 52.0f;
	fp[66]	= 53.0f;
	fp[67]	= 54.0f;
	fp[68]	= 55.0f;
	fp[69]	= 56.0f;
	fp[70]	= 57.0f;
	fp[71]	= 58.0f;
	fp[72]	= 59.0f;
	fp[73]	= 60.0f;
	fp[74]	= 61.0f;
	fp[75]	= 62.0f;
	fp[76]	= 63.0f;
	fp[77]	= 64.0f;
	fp[78]	= 65.0f;
	fp[79]	= 66.0f;
	fp[80]	= 67.0f;
	fp[81]	= 68.0f;
	fp[82]	= 69.0f;
	fp[83]	= 70.0f;
	fp[84]	= 71.0f;
	fp[85]	= 72.0f;
	fp[86]	= 73.0f;
	fp[87]	= 74.0f;
	fp[88]	= 75.0f;
	fp[89]	= 76.0f;
	fp[90]	= 77.0f;
	fp[91]	= 78.0f;

	return NL "layout(std430, binding = 0) buffer Input {" NL "  float data0[2];" NL "  float data1[3];" NL
			  "  vec2 data2;" NL "  float data3[5];" NL "  vec3 data4[2];" NL "  float data5[2];" NL
			  "  mat2 data6[2];" NL "  mat3 data7[2];" NL "  mat4 data8[2];" NL "} g_input;" NL
			  "layout(std430, binding = 1) buffer Output {" NL "  float data0[2];" NL "  float data1[3];" NL
			  "  vec2 data2;" NL "  float data3[5];" NL "  vec3 data4[2];" NL "  float data5[2];" NL
			  "  mat2 data6[2];" NL "  mat3 data7[2];" NL "  mat4 data8[2];" NL "} g_output;" NL "void main() {" NL
			  "  for (int i = 0; i < g_input.data0.length(); ++i) g_output.data0[i] = g_input.data0[i];" NL
			  "  for (int i = 0; i < g_input.data1.length(); ++i) g_output.data1[i] = g_input.data1[i];" NL
			  "  g_output.data2 = g_input.data2;" NL
			  "  for (int i = 0; i < g_input.data3.length(); ++i) g_output.data3[i] = g_input.data3[i];" NL
			  "  for (int i = 0; i < g_input.data4.length(); ++i) g_output.data4[i] = g_input.data4[i];" NL
			  "  for (int i = 0; i < g_input.data5.length(); ++i) g_output.data5[i] = g_input.data5[i];" NL
			  "  for (int i = 0; i < g_input.data6.length(); ++i) g_output.data6[i] = g_input.data6[i];" NL
			  "  for (int i = 0; i < g_input.data7.length(); ++i) g_output.data7[i] = g_input.data7[i];" NL
			  "  for (int i = 0; i < g_input.data8.length(); ++i) g_output.data8[i] = g_input.data8[i];" NL "}";
}